

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O3

bool dg::pta::PointerAnalysisFSInv::containsRemovableLocals(PSNode *where,PointsToSetT *S)

{
  ulong uVar1;
  PSNode *n;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  const_iterator __begin2;
  const_iterator local_48;
  
  local_48.container_it.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
       (S->pointers)._bits.
       super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
       .
       super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ._M_h._M_before_begin._M_nxt;
  local_48.container_end.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)(__node_type *)0x0
  ;
  local_48.pos = 0;
  if ((S->pointers)._bits.
      super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
      .
      super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ._M_h._M_element_count != 0) {
    uVar1 = *(ulong *)((long)&(((__node_type *)
                               local_48.container_it.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                               ._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                              ._M_storage._M_storage + 8);
    local_48.pos = 0;
    uVar2 = uVar1 & 1;
    while (uVar2 == 0) {
      if (local_48.pos == 0x3f) {
        local_48.pos = 0x40;
        break;
      }
      bVar4 = (byte)local_48.pos;
      local_48.pos = local_48.pos + 1;
      uVar2 = uVar1 >> (bVar4 & 0x3f) & 2;
    }
  }
  if (local_48.pos != 0 ||
      local_48.container_it.
      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur !=
      (__node_type *)0x0) {
    do {
      n = *(PSNode **)
           ((long)((_Hash_node_base *)
                  ((long)local_48.container_it.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                         ._M_cur + 8))->_M_nxt * 0x10 + -0x10 + local_48.pos * 0x10 + _getConstant);
      if ((((((n != NULLPTR) && (n != UNKNOWN_MEMORY)) && (n != INVALIDATED)) &&
           ((n != (PSNode *)0x0 && (*(int *)(n + 0x90) == 1)))) &&
          ((n[0xe9] == (PSNode)0x0 &&
           ((n[0xea] == (PSNode)0x0 && (*(long *)(n + 0xa0) == *(long *)(where + 0xa0))))))) &&
         (bVar3 = PointerAnalysisFS::isOnLoop(n), !bVar3)) {
        return true;
      }
      ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::const_iterator::operator++(&local_48);
    } while (local_48.container_it.
             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
             != (__node_type *)0x0 || local_48.pos != 0);
  }
  return false;
}

Assistant:

static bool containsRemovableLocals(PSNode *where, PointsToSetT &S) {
        for (const auto &ptr : S) {
            if (ptr.isNull() || ptr.isUnknown() || ptr.isInvalidated())
                continue;

            if (PSNodeAlloc *alloc = PSNodeAlloc::get(ptr.target)) {
                if (isLocal(alloc, where) && knownInstance(alloc))
                    return true;
            }
        }

        return false;
    }